

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall llvm::APFloat::print(APFloat *this,raw_ostream *OS)

{
  raw_ostream *this_00;
  size_t __n;
  StringRef Str;
  SmallVector<char,_16U> Buffer;
  SmallVectorImpl<char> local_38;
  undefined1 local_28 [16];
  
  local_38.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_38.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x10;
  __n = 3;
  local_38.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_28;
  toString(this,&local_38,0,3,true);
  this_00 = (raw_ostream *)
            raw_ostream::write(OS,(int)local_38.super_SmallVectorTemplateBase<char,_true>.
                                       super_SmallVectorTemplateCommon<char,_void>.
                                       super_SmallVectorBase.BeginX,
                               (void *)(local_38.super_SmallVectorTemplateBase<char,_true>.
                                        super_SmallVectorTemplateCommon<char,_void>.
                                        super_SmallVectorBase._8_8_ & 0xffffffff),__n);
  Str.Length = 1;
  Str.Data = "\n";
  raw_ostream::operator<<(this_00,Str);
  if ((undefined1 *)
      local_38.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_28) {
    free(local_38.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void APFloat::print(raw_ostream &OS) const {
  SmallVector<char, 16> Buffer;
  toString(Buffer);
  OS << Buffer << "\n";
}